

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall Parser::~Parser(Parser *this)

{
  std::__cxx11::string::~string((string *)&this->sex);
  std::__cxx11::string::~string((string *)&this->star);
  std::__cxx11::string::~string((string *)&this->animal);
  std::__cxx11::string::~string((string *)&this->address);
  std::__cxx11::string::~string((string *)&this->id);
  std::__cxx11::string::~string((string *)&this->provfile);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Parser(std::string str) :
            id(str), address(""), year(0), month(0), day(0), animal(""), star(""), sex("") {}